

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CppGenerator.cpp
# Opt level: O2

bool __thiscall CppGenerator::requireHash(CppGenerator *this,size_t *view_id,size_t *rel_id)

{
  View *pVVar1;
  long lVar2;
  ulong uVar3;
  
  pVVar1 = QueryCompiler::getView
                     ((this->_qc).super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr,*view_id);
  lVar2 = 0;
  for (uVar3 = 0; uVar3 != 100; uVar3 = uVar3 + 1) {
    if (((pVVar1->_fVars).super__Base_bitset<2UL>._M_w[uVar3 >> 6] >> (uVar3 & 0x3f) & 1) != 0) {
      if (uVar3 != this->sortOrders[*rel_id][lVar2]) break;
      lVar2 = lVar2 + 1;
    }
  }
  return uVar3 < 100;
}

Assistant:

bool CppGenerator::requireHash(const size_t& view_id, const size_t& rel_id)
{
    View* view = _qc->getView(view_id);
    size_t orderIdx = 0;
    for (size_t var = 0; var < NUM_OF_VARIABLES; ++var)
    {
        if (view->_fVars[var])
        {
            if (sortOrders[rel_id][orderIdx] != var)
                return true;
            ++orderIdx;
        }
    }
    
    return false;
}